

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
 fmt::v7::detail::write_nonfinite<char,std::back_insert_iterator<std::__cxx11::string>>
           (back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            out,bool isinf,basic_format_specs<char> *specs,float_specs *fspecs)

{
  uint uVar1;
  size_type sVar2;
  char *pcVar3;
  char *pcVar4;
  uint uVar5;
  char *pcVar6;
  ulong uVar7;
  ulong uVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *c;
  bool bVar9;
  
  uVar1 = *(uint *)&fspecs->field_0x4;
  uVar5 = uVar1 >> 8 & 0xff;
  uVar7 = (ulong)(uVar5 != 0) + 3;
  uVar8 = 0;
  if (uVar7 <= (uint)specs->width) {
    uVar8 = (uint)specs->width - uVar7;
  }
  uVar7 = uVar8 >> (*(byte *)((long)&basic_data<void>::left_padding_shifts +
                             (ulong)((byte)specs->field_0x9 & 0xf)) & 0x3f);
  sVar2 = (out.container)->_M_string_length;
  std::__cxx11::string::resize
            ((ulong)out.container,
             (uVar5 != 0) + (char)sVar2 + '\x03' + (specs->fill).size_ * (char)uVar8);
  pcVar3 = fill<char*,char>(((out.container)->_M_dataplus)._M_p + sVar2,uVar7,&specs->fill);
  if (uVar5 != 0) {
    *pcVar3 = *(char *)((long)&basic_data<void>::signs + (ulong)uVar5);
    pcVar3 = pcVar3 + 1;
  }
  bVar9 = (uVar1 >> 0x10 & 1) == 0;
  pcVar4 = "INF";
  if (bVar9) {
    pcVar4 = "inf";
  }
  pcVar6 = "NAN";
  if (bVar9) {
    pcVar6 = "nan";
  }
  if (isinf) {
    pcVar6 = pcVar4;
  }
  pcVar3[2] = pcVar6[2];
  *(undefined2 *)pcVar3 = *(undefined2 *)pcVar6;
  fill<char*,char>(pcVar3 + 3,uVar8 - uVar7,&specs->fill);
  return (back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          )out.container;
}

Assistant:

OutputIt write_nonfinite(OutputIt out, bool isinf,
                         const basic_format_specs<Char>& specs,
                         const float_specs& fspecs) {
  auto str =
      isinf ? (fspecs.upper ? "INF" : "inf") : (fspecs.upper ? "NAN" : "nan");
  constexpr size_t str_size = 3;
  auto sign = fspecs.sign;
  auto size = str_size + (sign ? 1 : 0);
  using iterator = remove_reference_t<decltype(reserve(out, 0))>;
  return write_padded(out, specs, size, [=](iterator it) {
    if (sign) *it++ = static_cast<Char>(data::signs[sign]);
    return copy_str<Char>(str, str + str_size, it);
  });
}